

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::TimestampTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool bVar1;
  reference pVVar2;
  undefined1 in_CL;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_40;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_38;
  const_iterator it;
  allocator<char> local_1a;
  undefined1 local_19;
  void *local_18;
  TimestampTestParam *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TimestampTestParam *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Record timestamp after ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  local_38._M_current =
       (VkPipelineStageFlagBits *)
       std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::begin
                 ((vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                   *)((long)this + 8));
  while( true ) {
    local_40._M_current =
         (VkPipelineStageFlagBits *)
         std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::end
                   ((vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                     *)((long)this + 8));
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
             ::operator*(&local_38);
    if (*pVVar2 != VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT) {
      pVVar2 = __gnu_cxx::
               __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
               ::operator*(&local_38);
      getPipelineStageFlagStr_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)(ulong)*pVVar2,VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT
                 ,(bool)in_CL);
      std::operator+(&local_60,&local_80,' ');
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
    ::operator++(&local_38,0);
  }
  if ((*(byte *)((long)this + 0x20) & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," out of the render pass");
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," in the renderpass");
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string TimestampTestParam::generateTestDescription(void) const
{
	std::string result("Record timestamp after ");

	for (StageFlagVector::const_iterator it = m_stageVec.begin(); it != m_stageVec.end(); it++)
	{
		if(*it != VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT)
		{
			result += getPipelineStageFlagStr(*it, true) + ' ';
		}
	}
	if(m_inRenderPass)
		result += " in the renderpass";
	else
		result += " out of the render pass";

	return result;
}